

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

Data * DL::Expressions::print_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *vm)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pDVar2;
  SourceLogger *pSVar3;
  Data *d;
  pointer d_00;
  stringstream stream;
  string_t local_1d0;
  stringstream local_1b0 [128];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  d_00 = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pDVar2 = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (d_00 != pDVar2) {
    do {
      print_val(d_00,(stringstream *)local_1b0);
      d_00 = d_00 + 1;
    } while (d_00 != pDVar2);
  }
  pSVar3 = vm->mLogger;
  std::__cxx11::stringbuf::str();
  (*pSVar3->_vptr_SourceLogger[3])(pSVar3,1,&local_1d0);
  paVar1 = &local_1d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  Data::Data(__return_storage_ptr__,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

Data print_func(const vector_t<Data>& args, VM& vm)
{
	std::stringstream stream;

	for (const Data& d : args)
		print_val(d, stream);

	vm.logger()->log(L_Info, stream.str());
	return Data();
}